

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O0

void emtjmp(emtcxdef *ctx,uchar op,uint lbl)

{
  ushort uVar1;
  short sVar2;
  undefined2 *puVar3;
  uint in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  uint fwd;
  short diff;
  emtldef *p;
  ushort in_stack_ffffffffffffffde;
  uint in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  
  puVar3 = (undefined2 *)(in_RDI + 0x26 + (ulong)in_EDX * 6);
  emtres((emtcxdef *)
         CONCAT26(in_stack_ffffffffffffffe6,
                  CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
         in_stack_ffffffffffffffde);
  uVar1 = *(ushort *)(in_RDI + 0x12);
  *(ushort *)(in_RDI + 0x12) = uVar1 + 1;
  *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)uVar1) = in_SIL;
  if ((*(byte *)(puVar3 + 2) & 1) == 0) {
    sVar2 = 0;
    in_stack_ffffffffffffffe0 =
         emtglbl((emtcxdef *)(ulong)CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(undefined2 *)(in_RDI + 0x26 + (ulong)in_stack_ffffffffffffffe0 * 6) = *puVar3;
    *(undefined2 *)(in_RDI + (ulong)in_stack_ffffffffffffffe0 * 6 + 0x28) =
         *(undefined2 *)(in_RDI + 0x12);
    *puVar3 = (short)in_stack_ffffffffffffffe0;
  }
  else {
    sVar2 = puVar3[1] - *(short *)(in_RDI + 0x12);
  }
  emtres((emtcxdef *)CONCAT26(sVar2,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
         in_stack_ffffffffffffffde);
  oswp2s((void *)(*(long *)(in_RDI + 0x18) + (long)(int)(uint)*(ushort *)(in_RDI + 0x12)),(int)sVar2
        );
  *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + 2;
  return;
}

Assistant:

void emtjmp(emtcxdef *ctx, uchar op, uint lbl)
{
    emtldef *p = &ctx->emtcxlbl[lbl];
    short    diff;
    uint     fwd;
    
    emtop(ctx, op);
    
    if (p->emtlflg & EMTLFSET)
        diff = p->emtlofs - ctx->emtcxofs;      /* back ref - compute delta */
    else
    {
        diff = 0;
        fwd = emtglbl(ctx);             /* get a forward ref fixup reminder */
        ctx->emtcxlbl[fwd].emtllnk = p->emtllnk;  /* link into label's list */
        ctx->emtcxlbl[fwd].emtlofs = ctx->emtcxofs;       /* remember where */
        p->emtllnk = fwd;          /* make it new head of this label's list */
    }
    emtint2s(ctx, diff);
}